

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.hpp
# Opt level: O0

string * generateStringVector_if_abi_cxx11_<helics::HandleManager,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__4,helics::generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)::__5>
                   (BasicHandleInfo *param_1,undefined8 param_2,undefined4 param_3)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  BasicHandleInfo *ele;
  const_iterator __end0;
  const_iterator __begin0;
  HandleManager *__range1;
  string *ret;
  HandleManager *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  BasicHandleInfo *this;
  string *in_stack_ffffffffffffff48;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  _Self local_78;
  _Self local_58;
  undefined8 local_38;
  allocator<char> local_1a;
  undefined1 local_19;
  undefined8 local_18;
  undefined4 local_10;
  BasicHandleInfo *local_8;
  
  local_19 = 0;
  this = param_1;
  local_18 = param_2;
  local_10 = param_3;
  local_8 = param_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<char>::~allocator(&local_1a);
  local_38 = local_18;
  helics::HandleManager::begin(in_stack_ffffffffffffff18);
  helics::HandleManager::end(in_stack_ffffffffffffff18);
  while (bVar1 = CLI::std::operator==(&local_58,&local_78), ((bVar1 ^ 0xffU) & 1) != 0) {
    CLI::std::
    _Deque_iterator<helics::BasicHandleInfo,_const_helics::BasicHandleInfo_&,_const_helics::BasicHandleInfo_*>
    ::operator*(&local_58);
    in_stack_ffffffffffffff27 =
         helics::
         generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)
         ::$_5::operator()((anon_class_4_1_ba1d46e5 *)this,param_1);
    if ((bool)in_stack_ffffffffffffff27) {
      helics::
      generateInterfaceQueryResults(std::basic_string_view<char,std::char_traits<char>>,helics::HandleManager_const&,helics::GlobalFederateId,std::function<void(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)>const&)
      ::$_4::operator()((anon_class_1_0_00000001 *)param_1,
                        (BasicHandleInfo *)
                        CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      helics::generateJsonQuotedString(in_stack_ffffffffffffff48);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_1);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                (char)((ulong)param_1 >> 0x38));
    }
    CLI::std::
    _Deque_iterator<helics::BasicHandleInfo,_const_helics::BasicHandleInfo_&,_const_helics::BasicHandleInfo_*>
    ::operator++((_Deque_iterator<helics::BasicHandleInfo,_const_helics::BasicHandleInfo_&,_const_helics::BasicHandleInfo_*>
                  *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  }
  sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  if (sVar2 < 2) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (char)((ulong)param_1 >> 0x38));
  }
  else {
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    *pvVar3 = ']';
  }
  return (string *)param_1;
}

Assistant:

std::string generateStringVector_if(const X& data, Proc generator, validator valid)
{
    static_assert(std::is_convertible<decltype(generator(*(data.begin()))), std::string>::value,
                  "generator output must be convertible to std::string");
    std::string ret{"["};
    for (auto& ele : data) {
        if (valid(ele)) {
            ret.append(helics::generateJsonQuotedString(generator(ele)));
            ret.push_back(',');
        }
    }
    if (ret.size() > 1) {
        ret.back() = ']';
    } else {
        ret.push_back(']');
    }
    return ret;
}